

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void text_sequence_doit(t_text_sequence *x,int argc,t_atom *argv)

{
  t_float *ptVar1;
  t_atom *ptVar2;
  t_atomtype tVar3;
  undefined8 uVar4;
  t_pd *x_00;
  char *pcVar5;
  int iVar6;
  _binbuf *x_01;
  t_atom *ptVar7;
  t_symbol *ptVar8;
  word wVar9;
  t_symbol *ptVar10;
  int iVar11;
  int iVar12;
  t_atom *ptVar13;
  int iVar14;
  long lVar15;
  t_atom *ptVar16;
  _outlet *x_02;
  uint uVar17;
  uint uVar18;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  t_float tVar24;
  t_float tVar25;
  t_float tVar26;
  t_float tVar27;
  t_atom tStack_68;
  t_atom *local_58;
  ulong local_50;
  t_atom *local_48;
  uint local_40;
  int local_3c;
  undefined4 local_38;
  bool local_31;
  ulong uVar19;
  
  ptVar16 = &tStack_68;
  local_48 = argv;
  local_3c = argc;
  x_01 = text_client_getbuf(&x->x_tc);
  if (x_01 == (_binbuf *)0x0) {
LAB_0018e575:
    x->x_onset = 0x7fffffff;
    x->x_loop = '\0';
    x->x_auto = '\0';
    outlet_bang(x->x_endout);
    return;
  }
  ptVar7 = binbuf_getvec(x_01);
  iVar6 = binbuf_getnatom(x_01);
  iVar21 = x->x_onset;
  if (iVar6 <= iVar21) goto LAB_0018e575;
  lVar15 = (long)iVar21;
  local_58 = ptVar7;
  if (x->x_lastto == (t_symbol *)0x0) {
    ptVar13 = ptVar7 + lVar15;
    if (ptVar7[lVar15].a_type == A_SYMBOL) {
      if ((ptVar13->a_w).w_symbol == x->x_waitsym) {
        ptVar7 = ptVar7 + lVar15;
        iVar12 = iVar21;
        do {
          iVar11 = iVar12;
          if ((ptVar7->a_type & ~A_FLOAT) == A_SEMI) break;
          iVar12 = iVar12 + 1;
          ptVar7 = ptVar7 + 1;
          iVar11 = iVar6;
        } while (iVar6 != iVar12);
        x->x_eaten = '\x01';
        iVar21 = iVar21 + 1;
        iVar12 = 1;
        goto LAB_0018e99e;
      }
      goto LAB_0018e53c;
    }
    if (((ptVar7[lVar15].a_type != A_FLOAT) || (x->x_waitargc == 0)) || (x->x_eaten != '\0'))
    goto LAB_0018e53c;
    iVar12 = x->x_waitargc + iVar21;
    if (iVar12 < iVar21) {
      iVar12 = iVar21;
    }
    lVar15 = iVar12 - lVar15;
    iVar14 = iVar21;
    do {
      bVar23 = lVar15 == 0;
      lVar15 = lVar15 + -1;
      iVar11 = iVar12;
      if ((bVar23) || (iVar11 = iVar14, ptVar13->a_type != A_FLOAT)) break;
      iVar14 = iVar14 + 1;
      ptVar13 = ptVar13 + 1;
      iVar11 = iVar6;
    } while (iVar6 != iVar14);
    x->x_eaten = '\x01';
    iVar12 = 0;
LAB_0018e99e:
    local_31 = true;
    local_38 = 0;
  }
  else {
LAB_0018e53c:
    ptVar7 = ptVar7 + lVar15;
    iVar11 = iVar21;
    do {
      tVar3 = ptVar7->a_type;
      if ((tVar3 & ~A_FLOAT) == A_SEMI) {
        x->x_eaten = '\0';
        local_31 = tVar3 != A_COMMA;
        local_38 = (int)CONCAT71((int7)((ulong)ptVar7 >> 8),1);
        iVar12 = 1;
        goto LAB_0018e5b4;
      }
      iVar11 = iVar11 + 1;
      ptVar7 = ptVar7 + 1;
    } while (iVar6 != iVar11);
    x->x_eaten = '\0';
    iVar12 = 1;
    local_31 = true;
    local_38 = (int)CONCAT71((uint7)(uint3)((uint)iVar11 >> 8),1);
    iVar11 = iVar6;
  }
LAB_0018e5b4:
  uVar17 = iVar11 - iVar21;
  uVar19 = (ulong)uVar17;
  iVar14 = 0x7fffffff;
  if (iVar12 + iVar11 < iVar6) {
    iVar14 = iVar12 + iVar11;
  }
  x->x_onset = iVar14;
  uVar20 = uVar17 + 1;
  if ((int)uVar17 < 99) {
    ptVar16 = &tStack_68 + -(long)(int)uVar20;
    ptVar7 = ptVar16;
    if (0 < (int)uVar17) goto LAB_0018e5fd;
  }
  else {
    ptVar7 = (t_atom *)getbytes((ulong)uVar20 << 4);
LAB_0018e5fd:
    ptVar13 = local_58;
    local_40 = uVar20;
    tStack_68.a_w.w_binbuf = (_binbuf *)(local_48 + -1);
    local_50 = uVar19;
    uVar22 = (ulong)uVar17;
    lVar15 = 0;
    do {
      iVar12 = local_3c;
      ptVar2 = local_48;
      iVar6 = *(int *)((long)&ptVar13[iVar21].a_type + lVar15);
      if (iVar6 - 1U < 2) {
        ptVar1 = (t_float *)((long)&ptVar13[iVar21].a_w + lVar15);
        tVar24 = ptVar1[-2];
        tVar25 = ptVar1[-1];
        tVar26 = *ptVar1;
        tVar27 = ptVar1[1];
LAB_0018e642:
        ptVar1 = (t_float *)((long)&ptVar7->a_type + lVar15);
        *ptVar1 = tVar24;
        ptVar1[1] = tVar25;
        ptVar1[2] = tVar26;
        ptVar1[3] = tVar27;
      }
      else if (iVar6 == 9) {
        ptVar8 = *(t_symbol **)((long)&ptVar13[iVar21].a_w + lVar15);
        ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e69f;
        ptVar8 = binbuf_realizedollsym(ptVar8,iVar12,ptVar2,0);
        if (ptVar8 == (t_symbol *)0x0) {
          uVar4 = **(undefined8 **)((long)&ptVar13[iVar21].a_w + lVar15);
          ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e6e6;
          pd_error((void *)0x0,"$%s: not enough arguments supplied",uVar4);
          *(undefined4 *)((long)&ptVar7->a_type + lVar15) = 2;
          ptVar8 = &s_symbol;
        }
        else {
          *(undefined4 *)((long)&ptVar7->a_type + lVar15) = 2;
        }
        *(t_symbol **)((long)&ptVar7->a_w + lVar15) = ptVar8;
      }
      else if (iVar6 == 8) {
        uVar17 = *(uint *)((long)&ptVar13[iVar21].a_w + lVar15);
        if (0 < (int)uVar17 && (int)uVar17 <= local_3c) {
          ptVar2 = (t_atom *)(tStack_68.a_w.w_binbuf + uVar17);
          tVar24 = (t_float)ptVar2->a_type;
          tVar25 = *(t_float *)&ptVar2->field_0x4;
          tVar26 = (ptVar2->a_w).w_float;
          tVar27 = *(t_float *)((long)&ptVar2->a_w + 4);
          goto LAB_0018e642;
        }
        ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e67a;
        pd_error(x,"argument $%d out of range");
        *(undefined4 *)((long)&ptVar7->a_type + lVar15) = 1;
        *(undefined4 *)((long)&ptVar7->a_w + lVar15) = 0;
      }
      else {
        ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e6bc;
        bug("text sequence");
      }
      lVar15 = lVar15 + 0x10;
      uVar22 = uVar22 - 1;
      uVar19 = local_50;
      uVar20 = local_40;
    } while (uVar22 != 0);
  }
  uVar18 = (uint)uVar19;
  uVar17 = uVar18;
  if ((char)local_38 == '\0') {
    x->x_loop = '\0';
    x->x_lastto = (t_symbol *)0x0;
    if (((uVar18 == 1) && (x->x_auto != '\0')) && (ptVar7->a_type == A_FLOAT)) {
      x->x_nextdelay = (ptVar7->a_w).w_float;
      return;
    }
    x_02 = x->x_waitout;
    if (x_02 == (_outlet *)0x0) {
      ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e8a1;
      bug("text sequence 3");
      goto LAB_0018e920;
    }
    x->x_auto = '\0';
  }
  else {
    if (x->x_mainout == (_outlet *)0x0) {
      if (uVar18 == 0) {
        return;
      }
      ptVar8 = x->x_lastto;
      ptVar13 = ptVar7;
      if (ptVar8 == (t_symbol *)0x0) {
        if (ptVar7->a_type == A_SYMBOL) {
          ptVar8 = (ptVar7->a_w).w_symbol;
          if (ptVar8 != (t_symbol *)0x0) {
            ptVar13 = ptVar7 + 1;
            uVar17 = uVar18 - 1;
            goto LAB_0018e850;
          }
          ptVar8 = (t_symbol *)0x0;
        }
        else {
          ptVar8 = (t_symbol *)0x0;
          ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e991;
          bug("text sequence 2");
        }
      }
      else {
LAB_0018e850:
        x_00 = ptVar8->s_thing;
        if (x_00 != (t_pd *)0x0) {
          if (local_31 != false) {
            ptVar8 = (t_symbol *)0x0;
          }
          x->x_lastto = ptVar8;
          if (((int)uVar17 < 1) || (ptVar13->a_type != A_SYMBOL)) {
            ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e968;
            pd_list(x_00,(t_symbol *)0x0,uVar17,ptVar13);
          }
          else {
            ptVar8 = (ptVar13->a_w).w_symbol;
            ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e88e;
            pd_typedmess(x_00,ptVar8,uVar17 - 1,ptVar13 + 1);
          }
          goto LAB_0018e920;
        }
        pcVar5 = ptVar8->s_name;
        ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e97e;
        pd_error(x,"%s: no such object",pcVar5);
      }
      ptVar10 = (t_symbol *)0x0;
      if (local_31 == false) {
        ptVar10 = ptVar8;
      }
      x->x_lastto = ptVar10;
      goto LAB_0018e920;
    }
    if (x->x_lastto == (t_symbol *)0x0) {
      bVar23 = true;
    }
    else {
      ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e741;
      memmove(ptVar7 + 1,ptVar7,(long)(int)uVar18 << 4);
      ptVar7->a_type = A_SYMBOL;
      ptVar8 = x->x_lastto;
      (ptVar7->a_w).w_symbol = ptVar8;
      bVar23 = ptVar8 == (t_symbol *)0x0;
      uVar17 = uVar20;
    }
    if (local_31 == false) {
      if ((!(bool)(bVar23 ^ 1U | uVar18 == 0)) && (ptVar7->a_type == A_SYMBOL)) {
        wVar9 = ptVar7->a_w;
        goto LAB_0018e8f1;
      }
    }
    else {
      wVar9.w_symbol = (t_symbol *)0x0;
LAB_0018e8f1:
      x->x_lastto = (t_symbol *)wVar9;
    }
    x_02 = x->x_mainout;
  }
  ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e920;
  outlet_list(x_02,(t_symbol *)0x0,uVar17,ptVar7);
LAB_0018e920:
  if (0x62 < (int)uVar18) {
    ptVar16[-1].a_w.w_symbol = (t_symbol *)0x18e935;
    freebytes(ptVar7,(ulong)uVar20 << 4);
  }
  return;
}

Assistant:

static void text_sequence_doit(t_text_sequence *x, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, i, onset, nfield, wait, eatsemi = 1, gotcomma = 0;
    t_atom *vec, *outvec, *ap;
    if (!b)
        goto nosequence;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (x->x_onset >= n)
    {
    nosequence:
        x->x_onset = 0x7fffffff;
        x->x_loop = x->x_auto = 0;
        outlet_bang(x->x_endout);
        return;
    }
    onset = x->x_onset;

        /* test if leading numbers, or a leading symbol equal to our
        "wait symbol", are directing us to wait */
    if (!x->x_lastto && (
        (vec[onset].a_type == A_FLOAT && x->x_waitargc && !x->x_eaten) ||
            (vec[onset].a_type == A_SYMBOL &&
                vec[onset].a_w.w_symbol == x->x_waitsym)))
    {
        if (vec[onset].a_type == A_FLOAT)
        {
            for (i = onset; i < n && i < onset + x->x_waitargc &&
                vec[i].a_type == A_FLOAT; i++)
                    ;
            x->x_eaten = 1;
            eatsemi = 0;
        }
        else
        {
            for (i = onset; i < n && vec[i].a_type != A_SEMI &&
                vec[i].a_type != A_COMMA; i++)
                    ;
            x->x_eaten = 1;
            onset++;    /* symbol isn't part of wait list */
        }
        wait = 1;
    }
    else    /* message to send */
    {
        for (i = onset; i < n && vec[i].a_type != A_SEMI &&
            vec[i].a_type != A_COMMA; i++)
                ;
        wait = 0;
        x->x_eaten = 0;
        if (i < n && vec[i].a_type == A_COMMA)
            gotcomma = 1;
    }
    nfield = i - onset;
    i += eatsemi;
    if (i >= n)
        i = 0x7fffffff;
    x->x_onset = i;
        /* generate output list, realizing dolar sign atoms.  Allocate one
        extra atom in case we want to prepend a symbol later */
    ATOMS_ALLOCA(outvec, nfield+1);
    for (i = 0, ap = vec+onset; i < nfield; i++, ap++)
    {
        int type = ap->a_type;
        if (type == A_FLOAT || type == A_SYMBOL)
            outvec[i] = *ap;
        else if (type == A_DOLLAR)
        {
            int atno = ap->a_w.w_index-1;
            if (atno < 0 || atno >= argc)
            {
                pd_error(x, "argument $%d out of range", atno+1);
                SETFLOAT(outvec+i, 0);
            }
            else outvec[i] = argv[atno];
        }
        else if (type == A_DOLLSYM)
        {
            t_symbol *s =
                binbuf_realizedollsym(ap->a_w.w_symbol, argc, argv, 0);
            if (s)
                SETSYMBOL(outvec+i, s);
            else
            {
                pd_error(0, "$%s: not enough arguments supplied",
                    ap->a_w.w_symbol->s_name);
                SETSYMBOL(outvec+i, &s_symbol);
            }
        }
        else bug("text sequence");
    }
    if (wait)
    {
        x->x_loop = 0;
        x->x_lastto = 0;
        if (x->x_auto && nfield == 1 && outvec[0].a_type == A_FLOAT)
            x->x_nextdelay = outvec[0].a_w.w_float;
        else if (!x->x_waitout)
            bug("text sequence 3");
        else
        {
            x->x_auto = 0;
            outlet_list(x->x_waitout, 0, nfield, outvec);
        }
    }
    else if (x->x_mainout)
    {
        int n2 = nfield;
        if (x->x_lastto)
        {
            memmove(outvec+1, outvec, nfield * sizeof(*outvec));
            SETSYMBOL(outvec, x->x_lastto);
            n2++;
        }
        if (!gotcomma)
            x->x_lastto = 0;
        else if (!x->x_lastto && nfield && outvec->a_type == A_SYMBOL)
            x->x_lastto = outvec->a_w.w_symbol;
        outlet_list(x->x_mainout, 0, n2, outvec);
    }
    else if (nfield)
    {
        t_symbol *tosym = x->x_lastto;
        t_pd *to = 0;
        t_atom *vecleft = outvec;
        int nleft = nfield;
        if (!tosym)
        {
            if (outvec[0].a_type != A_SYMBOL)
                bug("text sequence 2");
            else tosym = outvec[0].a_w.w_symbol;
            vecleft++;
            nleft--;
        }
        if (tosym)
        {
            if (!(to = tosym->s_thing))
                pd_error(x, "%s: no such object", tosym->s_name);
        }
        x->x_lastto = (gotcomma ? tosym : 0);
        if (to)
        {
            if (nleft > 0 && vecleft[0].a_type == A_SYMBOL)
                typedmess(to, vecleft->a_w.w_symbol, nleft-1, vecleft+1);
            else pd_list(to, 0, nleft, vecleft);
        }
    }
    ATOMS_FREEA(outvec, nfield+1);
}